

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

void __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_Test::testBody
          (TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  undefined4 extraout_var_01;
  cpputest_longlong cVar4;
  TestTerminator *pTVar5;
  undefined4 extraout_var_02;
  SimpleString local_80;
  SimpleString local_70;
  MockNamedValue local_60;
  
  SimpleString::SimpleString((SimpleString *)&local_60,"");
  pMVar2 = mock((SimpleString *)&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_80);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xe8))
            ((long *)CONCAT44(extraout_var,iVar1),1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  SimpleString::SimpleString((SimpleString *)&local_60,"");
  pMVar2 = mock((SimpleString *)&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_80);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xe8))
            ((long *)CONCAT44(extraout_var_00,iVar1),2);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0xa8))
            (&local_60,(long *)CONCAT44(extraout_var_01,iVar1));
  cVar4 = MockNamedValue::getLongLongIntValue(&local_60);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x10])
            (pUVar3,1,cVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x21f,pTVar5);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[8])(&local_60,pMVar2);
  cVar4 = MockNamedValue::getLongLongIntValue(&local_60);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x10])
            (pUVar3,1,cVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x220,pTVar5);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_80);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0xa8))
            (&local_60,(long *)CONCAT44(extraout_var_02,iVar1));
  cVar4 = MockNamedValue::getLongLongIntValue(&local_60);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x10])
            (pUVar3,2,cVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x221,pTVar5);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[8])(&local_60,pMVar2);
  cVar4 = MockNamedValue::getLongLongIntValue(&local_60);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x10])
            (pUVar3,2,cVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x222,pTVar5);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValueSetsDifferentValues)
{
    long long int expected_value = 1;
    long long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGLONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_expected_value, mock().returnValue().getLongLongIntValue());
}